

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O2

void ncnn::transpose_pack_A_tile(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  long lVar12;
  undefined1 (*pauVar14) [64];
  undefined1 (*pauVar15) [32];
  undefined1 (*pauVar16) [16];
  long lVar17;
  long lVar18;
  undefined1 (*pauVar19) [64];
  long lVar20;
  long lVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  undefined4 *puVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  size_t *psVar13;
  
  psVar13 = (size_t *)&A->w;
  if (A->dims == 3) {
    psVar13 = &A->cstep;
  }
  iVar1 = (int)*psVar13;
  lVar12 = (long)iVar1;
  uVar22 = 0;
  iVar23 = 0;
  if (0 < max_kk) {
    iVar23 = max_kk;
  }
  lVar25 = (long)(k * iVar1);
  lVar21 = (long)i;
  lVar17 = lVar25 * 4 + lVar21 * 4;
  local_88 = lVar25 * 4 + 4 + lVar21 * 4;
  lVar18 = lVar21 * 0x40;
  lVar20 = lVar18 + lVar25 * 4;
  lVar29 = lVar21 * 0x20;
  lVar21 = lVar21 * 0x10;
  local_90 = lVar18 + lVar25 * 4 + 0x40;
  local_68 = lVar18 + 0xc0 + lVar25 * 4;
  local_50 = lVar18 + 0x1c0 + lVar25 * 4;
  local_a8 = lVar18 + 0x3c0 + lVar25 * 4;
  lVar18 = lVar29 + lVar25 * 4;
  local_98 = lVar29 + 0x20 + lVar25 * 4;
  local_70 = lVar29 + 0x60 + lVar25 * 4;
  local_58 = lVar29 + 0xe0 + lVar25 * 4;
  local_40 = lVar29 + 0x1e0 + lVar25 * 4;
  lVar29 = lVar21 + lVar25 * 4;
  local_a0 = lVar21 + 0x10 + lVar25 * 4;
  local_78 = lVar21 + 0x30 + lVar25 * 4;
  local_60 = lVar21 + 0x70 + lVar25 * 4;
  local_48 = lVar21 + 0xf0 + lVar25 * 4;
  pauVar19 = (undefined1 (*) [64])AT->data;
  lVar25 = (long)max_ii;
  lVar30 = (long)(iVar1 << 4) * 4;
  lVar27 = (long)(iVar1 * 8) * 4;
  lVar28 = (long)(iVar1 * 4) * 4;
  lVar21 = lVar12 * 4;
  iVar1 = A->elempack;
  for (; (long)(uVar22 | 0xf) < lVar25; uVar22 = uVar22 + 0x10) {
    if (iVar1 == 0x10) {
      pauVar14 = (undefined1 (*) [64])((long)A->data + local_a8);
      for (iVar24 = 0xf; iVar24 < max_kk; iVar24 = iVar24 + 0x10) {
        auVar55 = vunpcklps_avx512f(pauVar14[-0xf],pauVar14[-0xe]);
        auVar56 = vunpckhps_avx512f(pauVar14[-0xf],pauVar14[-0xe]);
        auVar57 = vunpcklps_avx512f(pauVar14[-0xd],pauVar14[-0xc]);
        auVar58 = vunpckhps_avx512f(pauVar14[-0xd],pauVar14[-0xc]);
        auVar59 = vunpcklps_avx512f(pauVar14[-0xb],pauVar14[-10]);
        auVar60 = vunpckhps_avx512f(pauVar14[-0xb],pauVar14[-10]);
        auVar61 = vunpcklps_avx512f(pauVar14[-9],pauVar14[-8]);
        auVar62 = vunpckhps_avx512f(pauVar14[-9],pauVar14[-8]);
        auVar63 = vunpcklps_avx512f(pauVar14[-7],pauVar14[-6]);
        auVar64 = vunpckhps_avx512f(pauVar14[-7],pauVar14[-6]);
        auVar65 = vunpcklps_avx512f(pauVar14[-5],pauVar14[-4]);
        auVar66 = vunpckhps_avx512f(pauVar14[-5],pauVar14[-4]);
        auVar67 = vunpcklps_avx512f(pauVar14[-3],pauVar14[-2]);
        auVar68 = vunpckhps_avx512f(pauVar14[-3],pauVar14[-2]);
        auVar69 = vunpcklps_avx512f(pauVar14[-1],*pauVar14);
        auVar70 = vunpckhps_avx512f(pauVar14[-1],*pauVar14);
        auVar71 = vunpcklpd_avx512f(auVar55,auVar57);
        auVar55 = vunpckhpd_avx512f(auVar55,auVar57);
        auVar57 = vunpcklpd_avx512f(auVar56,auVar58);
        auVar56 = vunpckhpd_avx512f(auVar56,auVar58);
        auVar58 = vunpcklpd_avx512f(auVar59,auVar61);
        auVar59 = vunpckhpd_avx512f(auVar59,auVar61);
        auVar61 = vunpcklpd_avx512f(auVar60,auVar62);
        auVar60 = vunpckhpd_avx512f(auVar60,auVar62);
        auVar62 = vunpcklpd_avx512f(auVar63,auVar65);
        auVar63 = vunpckhpd_avx512f(auVar63,auVar65);
        auVar65 = vunpcklpd_avx512f(auVar64,auVar66);
        auVar64 = vunpckhpd_avx512f(auVar64,auVar66);
        auVar66 = vunpcklpd_avx512f(auVar67,auVar69);
        auVar67 = vunpckhpd_avx512f(auVar67,auVar69);
        auVar69 = vunpcklpd_avx512f(auVar68,auVar70);
        auVar68 = vunpckhpd_avx512f(auVar68,auVar70);
        auVar70 = vshuff64x2_avx512f(auVar71,auVar58,0x88);
        auVar72 = vshuff64x2_avx512f(auVar62,auVar66,0x88);
        auVar73 = vshuff64x2_avx512f(auVar55,auVar59,0x88);
        auVar74 = vshuff64x2_avx512f(auVar63,auVar67,0x88);
        auVar75 = vshuff64x2_avx512f(auVar57,auVar61,0x88);
        auVar76 = vshuff64x2_avx512f(auVar65,auVar69,0x88);
        auVar77 = vshuff64x2_avx512f(auVar56,auVar60,0x88);
        auVar78 = vshuff64x2_avx512f(auVar64,auVar68,0x88);
        auVar58 = vshuff64x2_avx512f(auVar71,auVar58,0xdd);
        auVar62 = vshuff64x2_avx512f(auVar62,auVar66,0xdd);
        auVar55 = vshuff64x2_avx512f(auVar55,auVar59,0xdd);
        auVar59 = vshuff64x2_avx512f(auVar63,auVar67,0xdd);
        auVar57 = vshuff64x2_avx512f(auVar57,auVar61,0xdd);
        auVar61 = vshuff64x2_avx512f(auVar65,auVar69,0xdd);
        auVar56 = vshuff64x2_avx512f(auVar56,auVar60,0xdd);
        auVar60 = vshuff64x2_avx512f(auVar64,auVar68,0xdd);
        auVar63 = vshuff64x2_avx512f(auVar70,auVar72,0x88);
        auVar64 = vshuff64x2_avx512f(auVar73,auVar74,0x88);
        auVar65 = vshuff64x2_avx512f(auVar75,auVar76,0x88);
        auVar66 = vshuff64x2_avx512f(auVar77,auVar78,0x88);
        auVar67 = vshuff64x2_avx512f(auVar58,auVar62,0x88);
        auVar68 = vshuff64x2_avx512f(auVar55,auVar59,0x88);
        auVar69 = vshuff64x2_avx512f(auVar57,auVar61,0x88);
        auVar71 = vshuff64x2_avx512f(auVar56,auVar60,0x88);
        auVar70 = vshuff64x2_avx512f(auVar70,auVar72,0xdd);
        auVar72 = vshuff64x2_avx512f(auVar73,auVar74,0xdd);
        auVar73 = vshuff64x2_avx512f(auVar75,auVar76,0xdd);
        auVar74 = vshuff64x2_avx512f(auVar77,auVar78,0xdd);
        auVar58 = vshuff64x2_avx512f(auVar58,auVar62,0xdd);
        auVar55 = vshuff64x2_avx512f(auVar55,auVar59,0xdd);
        auVar57 = vshuff64x2_avx512f(auVar57,auVar61,0xdd);
        auVar56 = vshuff64x2_avx512f(auVar56,auVar60,0xdd);
        *pauVar19 = auVar63;
        pauVar19[1] = auVar64;
        pauVar19[2] = auVar65;
        pauVar19[3] = auVar66;
        pauVar19[4] = auVar67;
        pauVar19[5] = auVar68;
        pauVar19[6] = auVar69;
        pauVar19[7] = auVar71;
        pauVar19[8] = auVar70;
        pauVar19[9] = auVar72;
        pauVar19[10] = auVar73;
        pauVar19[0xb] = auVar74;
        pauVar19[0xc] = auVar58;
        pauVar19[0xd] = auVar55;
        pauVar19[0xe] = auVar57;
        pauVar19[0xf] = auVar56;
        pauVar19 = pauVar19 + 0x10;
        pauVar14 = (undefined1 (*) [64])(*pauVar14 + lVar30);
      }
    }
    if (iVar1 == 8) {
      pauVar15 = (undefined1 (*) [32])((long)A->data + local_40);
      for (iVar24 = 7; iVar24 < max_kk; iVar24 = iVar24 + 8) {
        auVar45 = vunpcklps_avx512vl(pauVar15[-0xf],pauVar15[-0xe]);
        auVar4 = vunpckhps_avx(pauVar15[-0xf],pauVar15[-0xe]);
        auVar10 = vunpcklps_avx(pauVar15[-0xd],pauVar15[-0xc]);
        auVar5 = vunpckhps_avx(pauVar15[-0xd],pauVar15[-0xc]);
        auVar82 = vunpcklps_avx(pauVar15[-0xb],pauVar15[-10]);
        auVar80 = vunpckhps_avx(pauVar15[-0xb],pauVar15[-10]);
        auVar83 = vunpcklps_avx(pauVar15[-9],pauVar15[-8]);
        auVar79 = vunpckhps_avx(pauVar15[-9],pauVar15[-8]);
        auVar84 = vunpcklps_avx(pauVar15[-7],pauVar15[-6]);
        auVar6 = vunpckhps_avx(pauVar15[-7],pauVar15[-6]);
        auVar85 = vunpcklps_avx(pauVar15[-5],pauVar15[-4]);
        auVar81 = vunpckhps_avx(pauVar15[-5],pauVar15[-4]);
        auVar11 = vunpcklps_avx(pauVar15[-3],pauVar15[-2]);
        auVar7 = vunpckhps_avx(pauVar15[-3],pauVar15[-2]);
        auVar49 = vunpcklps_avx(pauVar15[-1],*pauVar15);
        auVar48 = vunpckhps_avx(pauVar15[-1],*pauVar15);
        auVar46 = vunpcklpd_avx512vl(auVar45,auVar10);
        auVar45 = vunpckhpd_avx512vl(auVar45,auVar10);
        auVar47 = vunpcklpd_avx512vl(auVar4,auVar5);
        auVar4 = vunpckhpd_avx(auVar4,auVar5);
        auVar10 = vunpcklpd_avx(auVar82,auVar83);
        auVar5 = vunpckhpd_avx(auVar82,auVar83);
        auVar82 = vunpcklpd_avx(auVar80,auVar79);
        auVar80 = vunpckhpd_avx(auVar80,auVar79);
        auVar83 = vunpcklpd_avx(auVar84,auVar85);
        auVar79 = vunpckhpd_avx(auVar84,auVar85);
        auVar84 = vunpcklpd_avx(auVar6,auVar81);
        auVar6 = vunpckhpd_avx(auVar6,auVar81);
        auVar85 = vunpcklpd_avx(auVar11,auVar49);
        auVar81 = vunpckhpd_avx(auVar11,auVar49);
        auVar11 = vunpcklpd_avx(auVar7,auVar48);
        auVar7 = vunpckhpd_avx(auVar7,auVar48);
        auVar48 = vinsertf32x4_avx512vl(auVar83,auVar85._0_16_,1);
        auVar49 = vinsertf32x4_avx512vl(auVar45,auVar5._0_16_,1);
        auVar50 = vinsertf32x4_avx512vl(auVar79,auVar81._0_16_,1);
        auVar51 = vinsertf32x4_avx512vl(auVar47,auVar82._0_16_,1);
        auVar52 = vinsertf32x4_avx512vl(auVar84,auVar11._0_16_,1);
        auVar53 = vinsertf32x4_avx512vl(auVar4,auVar80._0_16_,1);
        auVar54 = vinsertf32x4_avx512vl(auVar6,auVar7._0_16_,1);
        auVar55 = vinsertf64x4_avx512f
                            (ZEXT3264(CONCAT1616(auVar10._0_16_,auVar46._0_16_)),auVar48,1);
        auVar56 = vinsertf64x4_avx512f(ZEXT3264(auVar49),auVar50,1);
        auVar57 = vinsertf64x4_avx512f(ZEXT3264(auVar51),auVar52,1);
        auVar58 = vinsertf64x4_avx512f(ZEXT3264(auVar53),auVar54,1);
        auVar59 = vinsertf64x4_avx512f(ZEXT3264(auVar83),auVar85,1);
        auVar60 = vinsertf64x4_avx512f(ZEXT3264(auVar46),auVar10,1);
        auVar59 = vshuff64x2_avx512f(auVar60,auVar59,0xdd);
        auVar60 = vinsertf64x4_avx512f(ZEXT3264(auVar79),auVar81,1);
        auVar61 = vinsertf64x4_avx512f(ZEXT3264(auVar45),auVar5,1);
        auVar60 = vshuff64x2_avx512f(auVar61,auVar60,0xdd);
        auVar61 = vinsertf64x4_avx512f(ZEXT3264(auVar84),auVar11,1);
        auVar62 = vinsertf64x4_avx512f(ZEXT3264(auVar47),auVar82,1);
        auVar61 = vshuff64x2_avx512f(auVar62,auVar61,0xdd);
        auVar62 = vinsertf64x4_avx512f(ZEXT3264(auVar6),auVar7,1);
        auVar63 = vinsertf64x4_avx512f(ZEXT3264(auVar4),auVar80,1);
        auVar62 = vshuff64x2_avx512f(auVar63,auVar62,0xdd);
        *pauVar19 = auVar55;
        pauVar19[1] = auVar56;
        pauVar19[2] = auVar57;
        pauVar19[3] = auVar58;
        pauVar19[4] = auVar59;
        pauVar19[5] = auVar60;
        pauVar19[6] = auVar61;
        pauVar19[7] = auVar62;
        pauVar19 = pauVar19 + 8;
        pauVar15 = (undefined1 (*) [32])(*pauVar15 + lVar27);
      }
    }
    if (iVar1 == 4) {
      pauVar16 = (undefined1 (*) [16])((long)A->data + local_48);
      for (iVar24 = 3; iVar24 < max_kk; iVar24 = iVar24 + 4) {
        auVar32 = vunpcklps_avx512vl(pauVar16[-0xf],pauVar16[-0xe]);
        auVar33 = vunpcklps_avx512vl(pauVar16[-0xd],pauVar16[-0xc]);
        auVar2 = vunpckhps_avx(pauVar16[-0xf],pauVar16[-0xe]);
        auVar3 = vunpckhps_avx(pauVar16[-0xd],pauVar16[-0xc]);
        auVar34 = vunpcklpd_avx512vl(auVar32,auVar33);
        auVar35 = vunpckhpd_avx512vl(auVar32,auVar33);
        auVar36 = vunpcklpd_avx512vl(auVar2,auVar3);
        auVar2 = vunpckhpd_avx(auVar2,auVar3);
        auVar33 = vunpcklps_avx(pauVar16[-0xb],pauVar16[-10]);
        auVar37 = vunpcklps_avx512vl(pauVar16[-9],pauVar16[-8]);
        auVar3 = vunpckhps_avx(pauVar16[-0xb],pauVar16[-10]);
        auVar32 = vunpckhps_avx(pauVar16[-9],pauVar16[-8]);
        auVar38 = vunpcklpd_avx512vl(auVar33,auVar37);
        auVar39 = vunpckhpd_avx512vl(auVar33,auVar37);
        auVar8 = vunpcklpd_avx(auVar3,auVar32);
        auVar3 = vunpckhpd_avx(auVar3,auVar32);
        auVar37 = vunpcklps_avx(pauVar16[-7],pauVar16[-6]);
        auVar40 = vunpcklps_avx512vl(pauVar16[-5],pauVar16[-4]);
        auVar32 = vunpckhps_avx(pauVar16[-7],pauVar16[-6]);
        auVar33 = vunpckhps_avx(pauVar16[-5],pauVar16[-4]);
        auVar41 = vunpcklpd_avx512vl(auVar37,auVar40);
        auVar42 = vunpckhpd_avx512vl(auVar37,auVar40);
        auVar40 = vunpcklpd_avx(auVar32,auVar33);
        auVar32 = vunpckhpd_avx(auVar32,auVar33);
        auVar9 = vunpcklps_avx(pauVar16[-3],pauVar16[-2]);
        auVar43 = vunpcklps_avx512vl(pauVar16[-1],*pauVar16);
        auVar33 = vunpckhps_avx(pauVar16[-3],pauVar16[-2]);
        auVar37 = vunpckhps_avx(pauVar16[-1],*pauVar16);
        auVar44 = vunpcklpd_avx512vl(auVar9,auVar43);
        auVar43 = vunpckhpd_avx512vl(auVar9,auVar43);
        auVar9 = vunpcklpd_avx(auVar33,auVar37);
        auVar33 = vunpckhpd_avx(auVar33,auVar37);
        *(undefined1 (*) [16])*pauVar19 = auVar34;
        *(undefined1 (*) [16])(*pauVar19 + 0x10) = auVar38;
        *(undefined1 (*) [16])(*pauVar19 + 0x20) = auVar41;
        *(undefined1 (*) [16])(*pauVar19 + 0x30) = auVar44;
        *(undefined1 (*) [16])pauVar19[1] = auVar35;
        *(undefined1 (*) [16])(pauVar19[1] + 0x10) = auVar39;
        *(undefined1 (*) [16])(pauVar19[1] + 0x20) = auVar42;
        *(undefined1 (*) [16])(pauVar19[1] + 0x30) = auVar43;
        *(undefined1 (*) [16])pauVar19[2] = auVar36;
        *(undefined1 (*) [16])(pauVar19[2] + 0x10) = auVar8;
        *(undefined1 (*) [16])(pauVar19[2] + 0x20) = auVar40;
        *(undefined1 (*) [16])(pauVar19[2] + 0x30) = auVar9;
        *(undefined1 (*) [16])pauVar19[3] = auVar2;
        *(undefined1 (*) [16])(pauVar19[3] + 0x10) = auVar3;
        *(undefined1 (*) [16])(pauVar19[3] + 0x20) = auVar32;
        *(undefined1 (*) [16])(pauVar19[3] + 0x30) = auVar33;
        pauVar19 = pauVar19 + 4;
        pauVar16 = (undefined1 (*) [16])(*pauVar16 + lVar28);
      }
    }
    if (iVar1 == 1) {
      pauVar14 = (undefined1 (*) [64])((long)A->data + lVar17);
      iVar24 = iVar23;
      while (bVar31 = iVar24 != 0, iVar24 = iVar24 + -1, bVar31) {
        *pauVar19 = *pauVar14;
        pauVar19 = pauVar19 + 1;
        pauVar14 = (undefined1 (*) [64])(*pauVar14 + lVar21);
      }
    }
    lVar20 = lVar20 + 0x400;
    lVar18 = lVar18 + 0x200;
    lVar29 = lVar29 + 0x100;
    lVar17 = lVar17 + 0x40;
    local_90 = local_90 + 0x400;
    local_98 = local_98 + 0x200;
    local_a0 = local_a0 + 0x100;
    local_88 = local_88 + 0x40;
    local_68 = local_68 + 0x400;
    local_70 = local_70 + 0x200;
    local_78 = local_78 + 0x100;
    local_50 = local_50 + 0x400;
    local_58 = local_58 + 0x200;
    local_60 = local_60 + 0x100;
    local_a8 = local_a8 + 0x400;
    local_40 = local_40 + 0x200;
    local_48 = local_48 + 0x100;
  }
  for (; local_a8 = lVar18, (long)(uVar22 | 7) < lVar25; uVar22 = uVar22 + 8) {
    if (iVar1 == 0x10) {
      pauVar14 = (undefined1 (*) [64])((long)A->data + local_50);
      for (iVar24 = 0xf; iVar24 < max_kk; iVar24 = iVar24 + 0x10) {
        auVar55 = vunpcklps_avx512f(pauVar14[-7],pauVar14[-6]);
        auVar56 = vunpckhps_avx512f(pauVar14[-7],pauVar14[-6]);
        auVar57 = vunpcklps_avx512f(pauVar14[-5],pauVar14[-4]);
        auVar58 = vunpckhps_avx512f(pauVar14[-5],pauVar14[-4]);
        auVar59 = vunpcklps_avx512f(pauVar14[-3],pauVar14[-2]);
        auVar60 = vunpckhps_avx512f(pauVar14[-3],pauVar14[-2]);
        auVar61 = vunpcklps_avx512f(pauVar14[-1],*pauVar14);
        auVar62 = vunpckhps_avx512f(pauVar14[-1],*pauVar14);
        auVar63 = vunpcklpd_avx512f(auVar55,auVar57);
        auVar55 = vunpckhpd_avx512f(auVar55,auVar57);
        auVar57 = vunpcklpd_avx512f(auVar56,auVar58);
        auVar56 = vunpckhpd_avx512f(auVar56,auVar58);
        auVar58 = vunpcklpd_avx512f(auVar59,auVar61);
        auVar59 = vunpckhpd_avx512f(auVar59,auVar61);
        auVar61 = vunpcklpd_avx512f(auVar60,auVar62);
        auVar60 = vunpckhpd_avx512f(auVar60,auVar62);
        auVar62 = vshuff64x2_avx512f(auVar63,auVar58,0x88);
        auVar64 = vshuff64x2_avx512f(auVar55,auVar59,0x88);
        auVar65 = vshuff64x2_avx512f(auVar57,auVar61,0x88);
        auVar66 = vshuff64x2_avx512f(auVar56,auVar60,0x88);
        auVar58 = vshuff64x2_avx512f(auVar63,auVar58,0xdd);
        auVar55 = vshuff64x2_avx512f(auVar55,auVar59,0xdd);
        auVar57 = vshuff64x2_avx512f(auVar57,auVar61,0xdd);
        auVar56 = vshuff64x2_avx512f(auVar56,auVar60,0xdd);
        auVar59 = vshuff64x2_avx512f(auVar62,auVar64,0x88);
        auVar60 = vshuff64x2_avx512f(auVar65,auVar66,0x88);
        auVar61 = vshuff64x2_avx512f(auVar58,auVar55,0x88);
        auVar63 = vshuff64x2_avx512f(auVar57,auVar56,0x88);
        auVar62 = vshuff64x2_avx512f(auVar62,auVar64,0xdd);
        auVar64 = vshuff64x2_avx512f(auVar65,auVar66,0xdd);
        auVar55 = vshuff64x2_avx512f(auVar58,auVar55,0xdd);
        auVar56 = vshuff64x2_avx512f(auVar57,auVar56,0xdd);
        *pauVar19 = auVar59;
        pauVar19[1] = auVar60;
        pauVar19[2] = auVar61;
        pauVar19[3] = auVar63;
        pauVar19[4] = auVar62;
        pauVar19[5] = auVar64;
        pauVar19[6] = auVar55;
        pauVar19[7] = auVar56;
        pauVar19 = pauVar19 + 8;
        pauVar14 = (undefined1 (*) [64])(*pauVar14 + lVar30);
      }
    }
    if (iVar1 == 8) {
      pauVar15 = (undefined1 (*) [32])((long)A->data + local_58);
      for (iVar24 = 7; iVar24 < max_kk; iVar24 = iVar24 + 8) {
        auVar4 = vunpcklps_avx(pauVar15[-7],pauVar15[-6]);
        auVar5 = vunpckhps_avx(pauVar15[-7],pauVar15[-6]);
        auVar7 = vunpcklps_avx(pauVar15[-5],pauVar15[-4]);
        auVar80 = vunpckhps_avx(pauVar15[-5],pauVar15[-4]);
        auVar10 = vunpcklps_avx(pauVar15[-3],pauVar15[-2]);
        auVar79 = vunpckhps_avx(pauVar15[-3],pauVar15[-2]);
        auVar82 = vunpcklps_avx(pauVar15[-1],*pauVar15);
        auVar6 = vunpckhps_avx(pauVar15[-1],*pauVar15);
        auVar81 = vunpcklpd_avx(auVar4,auVar7);
        auVar4 = vunpckhpd_avx(auVar4,auVar7);
        auVar7 = vunpcklpd_avx(auVar5,auVar80);
        auVar5 = vunpckhpd_avx(auVar5,auVar80);
        auVar48 = vunpcklpd_avx(auVar10,auVar82);
        auVar80 = vunpckhpd_avx(auVar10,auVar82);
        auVar10 = vunpcklpd_avx(auVar79,auVar6);
        auVar79 = vunpckhpd_avx(auVar79,auVar6);
        auVar82._16_16_ = auVar48._0_16_;
        auVar82._0_16_ = auVar81._0_16_;
        auVar83._16_16_ = auVar80._0_16_;
        auVar83._0_16_ = auVar4._0_16_;
        auVar84._16_16_ = auVar10._0_16_;
        auVar84._0_16_ = auVar7._0_16_;
        auVar85._16_16_ = auVar79._0_16_;
        auVar85._0_16_ = auVar5._0_16_;
        auVar6 = vperm2f128_avx(auVar81,auVar48,0x31);
        auVar4 = vperm2f128_avx(auVar4,auVar80,0x31);
        auVar80 = vperm2f128_avx(auVar7,auVar10,0x31);
        auVar5 = vperm2f128_avx(auVar5,auVar79,0x31);
        *(undefined1 (*) [32])*pauVar19 = auVar82;
        *(undefined1 (*) [32])(*pauVar19 + 0x20) = auVar83;
        *(undefined1 (*) [32])pauVar19[1] = auVar84;
        *(undefined1 (*) [32])(pauVar19[1] + 0x20) = auVar85;
        *(undefined1 (*) [32])pauVar19[2] = auVar6;
        *(undefined1 (*) [32])(pauVar19[2] + 0x20) = auVar4;
        *(undefined1 (*) [32])pauVar19[3] = auVar80;
        *(undefined1 (*) [32])(pauVar19[3] + 0x20) = auVar5;
        pauVar19 = pauVar19 + 4;
        pauVar15 = (undefined1 (*) [32])(*pauVar15 + lVar27);
      }
    }
    if (iVar1 == 4) {
      pauVar16 = (undefined1 (*) [16])((long)A->data + local_60);
      for (iVar24 = 3; iVar24 < max_kk; iVar24 = iVar24 + 4) {
        auVar2 = vunpcklps_avx(pauVar16[-7],pauVar16[-6]);
        auVar33 = vunpcklps_avx(pauVar16[-5],pauVar16[-4]);
        auVar3 = vunpckhps_avx(pauVar16[-7],pauVar16[-6]);
        auVar32 = vunpckhps_avx(pauVar16[-5],pauVar16[-4]);
        auVar8 = vunpcklpd_avx(auVar2,auVar33);
        auVar2 = vunpckhpd_avx(auVar2,auVar33);
        auVar40 = vunpcklpd_avx(auVar3,auVar32);
        auVar3 = vunpckhpd_avx(auVar3,auVar32);
        auVar32 = vunpcklps_avx(pauVar16[-3],pauVar16[-2]);
        auVar34 = vunpcklps_avx(pauVar16[-1],*pauVar16);
        auVar33 = vunpckhps_avx(pauVar16[-3],pauVar16[-2]);
        auVar37 = vunpckhps_avx(pauVar16[-1],*pauVar16);
        auVar9 = vunpcklpd_avx(auVar32,auVar34);
        auVar32 = vunpckhpd_avx(auVar32,auVar34);
        auVar34 = vunpcklpd_avx(auVar33,auVar37);
        auVar33 = vunpckhpd_avx(auVar33,auVar37);
        *(undefined1 (*) [16])*pauVar19 = auVar8;
        *(undefined1 (*) [16])(*pauVar19 + 0x10) = auVar9;
        *(undefined1 (*) [16])(*pauVar19 + 0x20) = auVar2;
        *(undefined1 (*) [16])(*pauVar19 + 0x30) = auVar32;
        *(undefined1 (*) [16])pauVar19[1] = auVar40;
        *(undefined1 (*) [16])(pauVar19[1] + 0x10) = auVar34;
        *(undefined1 (*) [16])(pauVar19[1] + 0x20) = auVar3;
        *(undefined1 (*) [16])(pauVar19[1] + 0x30) = auVar33;
        pauVar19 = pauVar19 + 2;
        pauVar16 = (undefined1 (*) [16])(*pauVar16 + lVar28);
      }
    }
    if (iVar1 == 1) {
      pauVar15 = (undefined1 (*) [32])((long)A->data + lVar17);
      iVar24 = iVar23;
      while (bVar31 = iVar24 != 0, iVar24 = iVar24 + -1, bVar31) {
        *(undefined1 (*) [32])*pauVar19 = *pauVar15;
        pauVar19 = (undefined1 (*) [64])(*pauVar19 + 0x20);
        pauVar15 = (undefined1 (*) [32])(*pauVar15 + lVar21);
      }
    }
    lVar20 = lVar20 + 0x200;
    lVar29 = lVar29 + 0x80;
    lVar17 = lVar17 + 0x20;
    local_90 = local_90 + 0x200;
    local_98 = local_98 + 0x100;
    local_a0 = local_a0 + 0x80;
    local_88 = local_88 + 0x20;
    local_68 = local_68 + 0x200;
    local_70 = local_70 + 0x100;
    local_78 = local_78 + 0x80;
    local_50 = local_50 + 0x200;
    local_58 = local_58 + 0x100;
    local_60 = local_60 + 0x80;
    lVar18 = local_a8 + 0x100;
  }
  for (; (long)(uVar22 | 3) < lVar25; uVar22 = uVar22 + 4) {
    if (iVar1 == 0x10) {
      pauVar14 = (undefined1 (*) [64])((long)A->data + local_68);
      for (iVar24 = 0xf; iVar24 < max_kk; iVar24 = iVar24 + 0x10) {
        auVar55 = vunpcklps_avx512f(pauVar14[-3],pauVar14[-2]);
        auVar56 = vunpckhps_avx512f(pauVar14[-3],pauVar14[-2]);
        auVar57 = vunpcklps_avx512f(pauVar14[-1],*pauVar14);
        auVar58 = vunpckhps_avx512f(pauVar14[-1],*pauVar14);
        auVar59 = vunpcklpd_avx512f(auVar55,auVar57);
        auVar55 = vunpckhpd_avx512f(auVar55,auVar57);
        auVar57 = vunpcklpd_avx512f(auVar56,auVar58);
        auVar56 = vunpckhpd_avx512f(auVar56,auVar58);
        auVar58 = vshuff64x2_avx512f(auVar59,auVar55,0x88);
        auVar60 = vshuff64x2_avx512f(auVar57,auVar56,0x88);
        auVar55 = vshuff64x2_avx512f(auVar59,auVar55,0xdd);
        auVar56 = vshuff64x2_avx512f(auVar57,auVar56,0xdd);
        auVar57 = vshuff64x2_avx512f(auVar58,auVar60,0x88);
        auVar59 = vshuff64x2_avx512f(auVar55,auVar56,0x88);
        auVar58 = vshuff64x2_avx512f(auVar58,auVar60,0xdd);
        auVar55 = vshuff64x2_avx512f(auVar55,auVar56,0xdd);
        *pauVar19 = auVar57;
        pauVar19[1] = auVar59;
        pauVar19[2] = auVar58;
        pauVar19[3] = auVar55;
        pauVar19 = pauVar19 + 4;
        pauVar14 = (undefined1 (*) [64])(*pauVar14 + lVar30);
      }
    }
    if (iVar1 == 8) {
      pauVar15 = (undefined1 (*) [32])((long)A->data + local_70);
      for (iVar24 = 7; iVar24 < max_kk; iVar24 = iVar24 + 8) {
        auVar4 = vunpcklps_avx(pauVar15[-3],pauVar15[-2]);
        auVar5 = vunpckhps_avx(pauVar15[-3],pauVar15[-2]);
        auVar6 = vunpcklps_avx(pauVar15[-1],*pauVar15);
        auVar80 = vunpckhps_avx(pauVar15[-1],*pauVar15);
        auVar79 = vunpcklpd_avx(auVar4,auVar6);
        auVar4 = vunpckhpd_avx(auVar4,auVar6);
        auVar6 = vunpcklpd_avx(auVar5,auVar80);
        auVar5 = vunpckhpd_avx(auVar5,auVar80);
        auVar80._16_16_ = auVar4._0_16_;
        auVar80._0_16_ = auVar79._0_16_;
        auVar81._16_16_ = auVar5._0_16_;
        auVar81._0_16_ = auVar6._0_16_;
        auVar4 = vperm2f128_avx(auVar79,auVar4,0x31);
        auVar5 = vperm2f128_avx(auVar6,auVar5,0x31);
        *(undefined1 (*) [32])*pauVar19 = auVar80;
        *(undefined1 (*) [32])(*pauVar19 + 0x20) = auVar81;
        *(undefined1 (*) [32])pauVar19[1] = auVar4;
        *(undefined1 (*) [32])(pauVar19[1] + 0x20) = auVar5;
        pauVar19 = pauVar19 + 2;
        pauVar15 = (undefined1 (*) [32])(*pauVar15 + lVar27);
      }
    }
    if (iVar1 == 4) {
      pauVar16 = (undefined1 (*) [16])((long)A->data + local_78);
      for (iVar24 = 3; iVar24 < max_kk; iVar24 = iVar24 + 4) {
        auVar2 = vunpcklps_avx(pauVar16[-3],pauVar16[-2]);
        auVar37 = vunpcklps_avx(pauVar16[-1],*pauVar16);
        auVar3 = vunpckhps_avx(pauVar16[-3],pauVar16[-2]);
        auVar32 = vunpckhps_avx(pauVar16[-1],*pauVar16);
        auVar33 = vunpcklpd_avx(auVar2,auVar37);
        auVar2 = vunpckhpd_avx(auVar2,auVar37);
        auVar37 = vunpcklpd_avx(auVar3,auVar32);
        auVar3 = vunpckhpd_avx(auVar3,auVar32);
        *(undefined1 (*) [16])*pauVar19 = auVar33;
        *(undefined1 (*) [16])(*pauVar19 + 0x10) = auVar2;
        *(undefined1 (*) [16])(*pauVar19 + 0x20) = auVar37;
        *(undefined1 (*) [16])(*pauVar19 + 0x30) = auVar3;
        pauVar19 = pauVar19 + 1;
        pauVar16 = (undefined1 (*) [16])(*pauVar16 + lVar28);
      }
    }
    if (iVar1 == 1) {
      pauVar16 = (undefined1 (*) [16])((long)A->data + lVar17);
      iVar24 = iVar23;
      while (bVar31 = iVar24 != 0, iVar24 = iVar24 + -1, bVar31) {
        *(undefined1 (*) [16])*pauVar19 = *pauVar16;
        pauVar19 = (undefined1 (*) [64])(*pauVar19 + 0x10);
        pauVar16 = (undefined1 (*) [16])(*pauVar16 + lVar21);
      }
    }
    lVar20 = lVar20 + 0x100;
    local_a8 = local_a8 + 0x80;
    lVar29 = lVar29 + 0x40;
    lVar17 = lVar17 + 0x10;
    local_90 = local_90 + 0x100;
    local_98 = local_98 + 0x80;
    local_a0 = local_a0 + 0x40;
    local_88 = local_88 + 0x10;
    local_68 = local_68 + 0x100;
    local_70 = local_70 + 0x80;
    local_78 = local_78 + 0x40;
  }
  for (; (long)(uVar22 | 1) < lVar25; uVar22 = uVar22 + 2) {
    if (iVar1 == 0x10) {
      pauVar14 = (undefined1 (*) [64])((long)A->data + local_90);
      for (iVar24 = 0xf; iVar24 < max_kk; iVar24 = iVar24 + 0x10) {
        auVar55 = vunpcklps_avx512f(pauVar14[-1],*pauVar14);
        auVar56 = vunpckhps_avx512f(pauVar14[-1],*pauVar14);
        auVar57 = vshuff64x2_avx512f(auVar55,auVar56,0x88);
        auVar55 = vshuff64x2_avx512f(auVar55,auVar56,0xdd);
        auVar56 = vshuff64x2_avx512f(auVar57,auVar55,0x88);
        auVar55 = vshuff64x2_avx512f(auVar57,auVar55,0xdd);
        *pauVar19 = auVar56;
        pauVar19[1] = auVar55;
        pauVar19 = pauVar19 + 2;
        pauVar14 = (undefined1 (*) [64])(*pauVar14 + lVar30);
      }
    }
    if (iVar1 == 8) {
      pauVar15 = (undefined1 (*) [32])((long)A->data + local_98);
      for (iVar24 = 7; iVar24 < max_kk; iVar24 = iVar24 + 8) {
        auVar5 = vunpcklps_avx(pauVar15[-1],*pauVar15);
        auVar4 = vunpckhps_avx(pauVar15[-1],*pauVar15);
        auVar79._16_16_ = auVar4._0_16_;
        auVar79._0_16_ = auVar5._0_16_;
        auVar4 = vperm2f128_avx(auVar5,auVar4,0x31);
        *(undefined1 (*) [32])*pauVar19 = auVar79;
        *(undefined1 (*) [32])(*pauVar19 + 0x20) = auVar4;
        pauVar19 = pauVar19 + 1;
        pauVar15 = (undefined1 (*) [32])(*pauVar15 + lVar27);
      }
    }
    if (iVar1 == 4) {
      pauVar16 = (undefined1 (*) [16])((long)A->data + local_a0);
      for (iVar24 = 3; iVar24 < max_kk; iVar24 = iVar24 + 4) {
        auVar3 = vunpcklps_avx(pauVar16[-1],*pauVar16);
        auVar2 = vunpckhps_avx(pauVar16[-1],*pauVar16);
        *(undefined1 (*) [16])*pauVar19 = auVar3;
        *(undefined1 (*) [16])(*pauVar19 + 0x10) = auVar2;
        pauVar19 = (undefined1 (*) [64])(*pauVar19 + 0x20);
        pauVar16 = (undefined1 (*) [16])(*pauVar16 + lVar28);
      }
    }
    if (iVar1 == 1) {
      puVar26 = (undefined4 *)((long)A->data + local_88);
      iVar24 = iVar23;
      while (bVar31 = iVar24 != 0, iVar24 = iVar24 + -1, bVar31) {
        *(undefined4 *)*pauVar19 = puVar26[-1];
        *(undefined4 *)(*pauVar19 + 4) = *puVar26;
        pauVar19 = (undefined1 (*) [64])(*pauVar19 + 8);
        puVar26 = puVar26 + lVar12;
      }
    }
    lVar20 = lVar20 + 0x80;
    local_a8 = local_a8 + 0x40;
    lVar29 = lVar29 + 0x20;
    lVar17 = lVar17 + 8;
    local_90 = local_90 + 0x80;
    local_98 = local_98 + 0x40;
    local_a0 = local_a0 + 0x20;
    local_88 = local_88 + 8;
  }
  for (; (long)uVar22 < lVar25; uVar22 = uVar22 + 1) {
    if (iVar1 == 0x10) {
      pauVar14 = (undefined1 (*) [64])((long)A->data + lVar20);
      for (iVar24 = 0xf; iVar24 < max_kk; iVar24 = iVar24 + 0x10) {
        *pauVar19 = *pauVar14;
        pauVar19 = pauVar19 + 1;
        pauVar14 = (undefined1 (*) [64])(*pauVar14 + lVar30);
      }
    }
    if (iVar1 == 8) {
      pauVar15 = (undefined1 (*) [32])((long)A->data + local_a8);
      for (iVar24 = 7; iVar24 < max_kk; iVar24 = iVar24 + 8) {
        *(undefined1 (*) [32])*pauVar19 = *pauVar15;
        pauVar19 = (undefined1 (*) [64])(*pauVar19 + 0x20);
        pauVar15 = (undefined1 (*) [32])(*pauVar15 + lVar27);
      }
    }
    if (iVar1 == 4) {
      pauVar16 = (undefined1 (*) [16])((long)A->data + lVar29);
      for (iVar24 = 3; iVar24 < max_kk; iVar24 = iVar24 + 4) {
        *(undefined1 (*) [16])*pauVar19 = *pauVar16;
        pauVar19 = (undefined1 (*) [64])(*pauVar19 + 0x10);
        pauVar16 = (undefined1 (*) [16])(*pauVar16 + lVar28);
      }
    }
    if (iVar1 == 1) {
      puVar26 = (undefined4 *)((long)A->data + lVar17);
      iVar24 = iVar23;
      while (bVar31 = iVar24 != 0, iVar24 = iVar24 + -1, bVar31) {
        *(undefined4 *)*pauVar19 = *puVar26;
        pauVar19 = (undefined1 (*) [64])(*pauVar19 + 4);
        puVar26 = puVar26 + lVar12;
      }
    }
    lVar20 = lVar20 + 0x40;
    local_a8 = local_a8 + 0x20;
    lVar29 = lVar29 + 0x10;
    lVar17 = lVar17 + 4;
  }
  return;
}

Assistant:

static void transpose_pack_A_tile(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    const int elempack = A.elempack;
    const int A_hstep = A.dims == 3 ? (int)A.cstep : A.w;

    float* pp = AT;

    int ii = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; ii + 15 < max_ii; ii += 16)
    {
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                __m512 _r8 = _mm512_load_ps(p0 + 16 * 8);
                __m512 _r9 = _mm512_load_ps(p0 + 16 * 9);
                __m512 _ra = _mm512_load_ps(p0 + 16 * 10);
                __m512 _rb = _mm512_load_ps(p0 + 16 * 11);
                __m512 _rc = _mm512_load_ps(p0 + 16 * 12);
                __m512 _rd = _mm512_load_ps(p0 + 16 * 13);
                __m512 _re = _mm512_load_ps(p0 + 16 * 14);
                __m512 _rf = _mm512_load_ps(p0 + 16 * 15);
                transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                _mm512_store_ps(pp + 16 * 8, _r8);
                _mm512_store_ps(pp + 16 * 9, _r9);
                _mm512_store_ps(pp + 16 * 10, _ra);
                _mm512_store_ps(pp + 16 * 11, _rb);
                _mm512_store_ps(pp + 16 * 12, _rc);
                _mm512_store_ps(pp + 16 * 13, _rd);
                _mm512_store_ps(pp + 16 * 14, _re);
                _mm512_store_ps(pp + 16 * 15, _rf);
                pp += 256;
                p0 += A_hstep * 16;
            }
        }
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                __m256 _r8 = _mm256_load_ps(p0 + 8 * 8);
                __m256 _r9 = _mm256_load_ps(p0 + 8 * 9);
                __m256 _ra = _mm256_load_ps(p0 + 8 * 10);
                __m256 _rb = _mm256_load_ps(p0 + 8 * 11);
                __m256 _rc = _mm256_load_ps(p0 + 8 * 12);
                __m256 _rd = _mm256_load_ps(p0 + 8 * 13);
                __m256 _re = _mm256_load_ps(p0 + 8 * 14);
                __m256 _rf = _mm256_load_ps(p0 + 8 * 15);

                transpose8x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);
                __m512 _rr0 = _mm512_insertf32x8(_mm512_castps256_ps512(_r0), _r1, 1);
                __m512 _rr1 = _mm512_insertf32x8(_mm512_castps256_ps512(_r2), _r3, 1);
                __m512 _rr2 = _mm512_insertf32x8(_mm512_castps256_ps512(_r4), _r5, 1);
                __m512 _rr3 = _mm512_insertf32x8(_mm512_castps256_ps512(_r6), _r7, 1);
                __m512 _rr4 = _mm512_insertf32x8(_mm512_castps256_ps512(_r8), _r9, 1);
                __m512 _rr5 = _mm512_insertf32x8(_mm512_castps256_ps512(_ra), _rb, 1);
                __m512 _rr6 = _mm512_insertf32x8(_mm512_castps256_ps512(_rc), _rd, 1);
                __m512 _rr7 = _mm512_insertf32x8(_mm512_castps256_ps512(_re), _rf, 1);

                _mm512_store_ps(pp, _rr0);
                _mm512_store_ps(pp + 16 * 1, _rr1);
                _mm512_store_ps(pp + 16 * 2, _rr2);
                _mm512_store_ps(pp + 16 * 3, _rr3);
                _mm512_store_ps(pp + 16 * 4, _rr4);
                _mm512_store_ps(pp + 16 * 5, _rr5);
                _mm512_store_ps(pp + 16 * 6, _rr6);
                _mm512_store_ps(pp + 16 * 7, _rr7);
                pp += 128;
                p0 += A_hstep * 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                __m128 _r8 = _mm_load_ps(p0 + 4 * 8);
                __m128 _r9 = _mm_load_ps(p0 + 4 * 9);
                __m128 _ra = _mm_load_ps(p0 + 4 * 10);
                __m128 _rb = _mm_load_ps(p0 + 4 * 11);
                __m128 _rc = _mm_load_ps(p0 + 4 * 12);
                __m128 _rd = _mm_load_ps(p0 + 4 * 13);
                __m128 _re = _mm_load_ps(p0 + 4 * 14);
                __m128 _rf = _mm_load_ps(p0 + 4 * 15);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                _MM_TRANSPOSE4_PS(_rc, _rd, _re, _rf);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r4);
                _mm_store_ps(pp + 4 * 2, _r8);
                _mm_store_ps(pp + 4 * 3, _rc);
                _mm_store_ps(pp + 4 * 4, _r1);
                _mm_store_ps(pp + 4 * 5, _r5);
                _mm_store_ps(pp + 4 * 6, _r9);
                _mm_store_ps(pp + 4 * 7, _rd);
                _mm_store_ps(pp + 4 * 8, _r2);
                _mm_store_ps(pp + 4 * 9, _r6);
                _mm_store_ps(pp + 4 * 10, _ra);
                _mm_store_ps(pp + 4 * 11, _re);
                _mm_store_ps(pp + 4 * 12, _r3);
                _mm_store_ps(pp + 4 * 13, _r7);
                _mm_store_ps(pp + 4 * 14, _rb);
                _mm_store_ps(pp + 4 * 15, _rf);
                pp += 64;
                p0 += A_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm512_store_ps(pp, _mm512_loadu_ps(p0));
                pp += 16;
                p0 += A_hstep;
            }
        }
    }
#endif // __AVX512F__
    for (; ii + 7 < max_ii; ii += 8)
    {
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                transpose16x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                pp += 128;
                p0 += A_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                _mm256_store_ps(pp + 8 * 4, _r4);
                _mm256_store_ps(pp + 8 * 5, _r5);
                _mm256_store_ps(pp + 8 * 6, _r6);
                _mm256_store_ps(pp + 8 * 7, _r7);
                pp += 64;
                p0 += A_hstep * 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r4);
                _mm_store_ps(pp + 4 * 2, _r1);
                _mm_store_ps(pp + 4 * 3, _r5);
                _mm_store_ps(pp + 4 * 4, _r2);
                _mm_store_ps(pp + 4 * 5, _r6);
                _mm_store_ps(pp + 4 * 6, _r3);
                _mm_store_ps(pp + 4 * 7, _r7);
                pp += 32;
                p0 += A_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm256_store_ps(pp, _mm256_loadu_ps(p0));
                pp += 8;
                p0 += A_hstep;
            }
        }
    }
#endif // __AVX__
    for (; ii + 3 < max_ii; ii += 4)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                pp += 64;
                p0 += A_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                pp += 32;
                p0 += A_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r1);
                _mm_store_ps(pp + 4 * 2, _r2);
                _mm_store_ps(pp + 4 * 3, _r3);
                pp += 16;
                p0 += A_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_loadu_ps(p0));
                pp += 4;
                p0 += A_hstep;
            }
        }
    }
#endif // __SSE2__
    for (; ii + 1 < max_ii; ii += 2)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16);
                transpose16x2_ps(_r0, _r1);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16, _r1);
                pp += 32;
                p0 += A_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8);
                transpose8x2_ps(_r0, _r1);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                pp += 16;
                p0 += A_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_store_ps(pp, _tmp0);
                _mm_store_ps(pp + 4, _tmp1);
                pp += 8;
                p0 += A_hstep * 4;
            }
        }
#endif // __SSE2__
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                pp += 2;
                p0 += A_hstep;
            }
        }
    }
    for (; ii < max_ii; ii += 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                _mm512_store_ps(pp, _mm512_load_ps(p0));
                pp += 16;
                p0 += A_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                pp += 8;
                p0 += A_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                pp += 4;
                p0 += A_hstep * 4;
            }
        }
#endif // __SSE2__
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp += 1;
                p0 += A_hstep;
            }
        }
    }
}